

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O1

bool dxil_spv::emit_wave_quad_op_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Builder *this;
  Value *pVVar3;
  Operation *this_00;
  Capability *__v;
  uint32_t swap_kind;
  uint local_34;
  Capability local_30 [2];
  
  this = Converter::Impl::builder(impl);
  if ((impl->execution_mode_meta).synthesize_dummy_derivatives == true) {
    pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar2);
    bVar1 = true;
  }
  else {
    bVar1 = get_constant_operand(&instruction->super_Instruction,2,&local_34);
    if (bVar1) {
      if ((impl->execution_model & ~ExecutionModelTessellationControl) == ExecutionModelFragment) {
        this_00 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,(Value *)instruction);
        IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar2 = spv::Builder::makeIntConstant(this,IVar2,3,false);
        Operation::add_id(this_00,IVar2);
        pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
        Operation::add_id(this_00,IVar2);
        IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar2 = spv::Builder::makeIntConstant(this,IVar2,local_34,false);
        Operation::add_id(this_00,IVar2);
        __v = local_30;
        local_30[0] = CapabilityGroupNonUniformQuad;
      }
      else {
        this_00 = Converter::Impl::allocate(impl,OpGroupNonUniformShuffleXor,(Value *)instruction);
        IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar2 = spv::Builder::makeIntConstant(this,IVar2,3,false);
        Operation::add_id(this_00,IVar2);
        pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
        Operation::add_id(this_00,IVar2);
        IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar2 = spv::Builder::makeIntConstant(this,IVar2,local_34 + 1,false);
        Operation::add_id(this_00,IVar2);
        __v = local_30 + 1;
        local_30[1] = 0x41;
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&this->capabilities,__v);
      Converter::Impl::add(impl,this_00,false);
    }
  }
  return bVar1;
}

Assistant:

bool emit_wave_quad_op_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (impl.execution_mode_meta.synthesize_dummy_derivatives)
	{
		impl.rewrite_value(instruction, impl.get_id_for_value(instruction->getOperand(1)));
		return true;
	}

	// Matches with SPIR-V.
	uint32_t swap_kind;
	if (!get_constant_operand(instruction, 2, &swap_kind))
		return false;

	Operation *op;
	if (execution_model_can_quad_op(impl.execution_model))
	{
		op = impl.allocate(spv::OpGroupNonUniformQuadSwap, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		op->add_id(builder.makeUintConstant(swap_kind));
		builder.addCapability(spv::CapabilityGroupNonUniformQuad);
	}
	else
	{
		// Use ShuffleXor for non-fragment stages.
		op = impl.allocate(spv::OpGroupNonUniformShuffleXor, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

		// 1: Horizontal, 2: Vertical, 3: Diagonal.
		op->add_id(builder.makeUintConstant(swap_kind + 1));
		builder.addCapability(spv::CapabilityGroupNonUniformShuffle);
	}

	impl.add(op);
	return true;
}